

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileChangeNotifier.cpp
# Opt level: O0

void __thiscall FileChangeNotifier::Update(FileChangeNotifier *this,float fDeltaTime)

{
  float *pfVar1;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  FileChangeNotifier *pFStack_10;
  float fDeltaTime_local;
  FileChangeNotifier *this_local;
  
  if ((this->m_bActive & 1U) != 0) {
    local_14 = fDeltaTime;
    pFStack_10 = this;
    FW::FileWatcher::update(this->m_pFileWatcher);
    local_18 = 0.0;
    local_1c = this->m_fTimeUntilNextAllowedRecompile - local_14;
    pfVar1 = std::max<float>(&local_18,&local_1c);
    this->m_fTimeUntilNextAllowedRecompile = *pfVar1;
    local_20 = 0.0;
    local_24 = this->m_fFileChangeSpamTimeRemaining - local_14;
    pfVar1 = std::max<float>(&local_20,&local_24);
    this->m_fFileChangeSpamTimeRemaining = *pfVar1;
    if ((this->m_bRecompilePending & 1U) != 0) {
      TriggerNotificationIfPossible(this);
    }
  }
  return;
}

Assistant:

void FileChangeNotifier::Update( float fDeltaTime )
{
	if (m_bActive)
	{
        m_pFileWatcher->update();
		m_fTimeUntilNextAllowedRecompile = max(0.0f, m_fTimeUntilNextAllowedRecompile - fDeltaTime);
		m_fFileChangeSpamTimeRemaining = max(0.0f, m_fFileChangeSpamTimeRemaining - fDeltaTime);

		if (m_bRecompilePending)
		{
			TriggerNotificationIfPossible();
		}
	}
}